

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSimpleUpdater.cpp
# Opt level: O3

void __thiscall QSimpleUpdater::~QSimpleUpdater(QSimpleUpdater *this)

{
  Data *pDVar1;
  qsizetype qVar2;
  long lVar3;
  
  *(undefined ***)this = &PTR_metaObject_001202a0;
  QList<QString>::clear(&URLS);
  qVar2 = UPDATERS.d.size;
  pDVar1 = UPDATERS.d.d;
  if (UPDATERS.d.d != (Data *)0x0) {
    LOCK();
    ((UPDATERS.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((UPDATERS.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (qVar2 != 0) {
    lVar3 = 0;
    do {
      QObject::deleteLater();
      lVar3 = lVar3 + 8;
    } while (qVar2 * 8 != lVar3);
  }
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,8,8);
    }
  }
  QList<Updater_*>::clear(&UPDATERS);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSimpleUpdater::~QSimpleUpdater()
{
   URLS.clear();

   foreach (Updater *updater, UPDATERS)
      updater->deleteLater();

   UPDATERS.clear();
}